

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

char * base64_encode(char *s,size_t len)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  char *out;
  char *d;
  size_t sStack_20;
  int v;
  size_t len_local;
  char *s_local;
  
  s_local = (char *)malloc((len * 4 + 2) / 3 + 1);
  out = s_local;
  sStack_20 = len;
  len_local = (size_t)s;
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    while (2 < sStack_20) {
      bVar1 = *(byte *)(len_local + 2);
      uVar2 = (uint)*(byte *)len_local << 0x10 | (uint)*(byte *)(len_local + 1) << 8 | (uint)bVar1;
      len_local = len_local + 3;
      sStack_20 = sStack_20 - 3;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(int)uVar2 >> 0x12];
      out[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((int)uVar2 >> 0xc & 0x3f)];
      out[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((int)uVar2 >> 6 & 0x3f)];
      out[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(bVar1 & 0x3f)];
      out = out + 4;
    }
    if (sStack_20 != 0) {
      if (sStack_20 == 1) {
        bVar1 = *(byte *)len_local;
        pcVar3 = out + 1;
        *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((uint)bVar1 << 0x10) >> 0x12];
        out = out + 2;
        *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)((uint)bVar1 << 0x10) >> 0xc & 0x3f)];
      }
      else if (sStack_20 == 2) {
        uVar2 = (uint)*(byte *)len_local << 0x10 | (uint)*(byte *)(len_local + 1) << 8;
        *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)uVar2 >> 0x12];
        pcVar3 = out + 2;
        out[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(int)((int)uVar2 >> 0xc & 0x3f)];
        out = out + 3;
        *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar2 >> 6 & 0x3f)];
      }
    }
    *out = '\0';
  }
  return s_local;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  unsigned char ibuf[3];
  unsigned char obuf[4];
  int i;
  int inputparts;
  char *output;
  char *base64data;
  const char *indata = inputbuff;
  const char *padstr = &table64[64];    /* Point to padding string. */

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(indata);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc(insize * 4 / 3 + 4);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  while(insize > 0) {
    for(i = inputparts = 0; i < 3; i++) {
      if(insize > 0) {
        inputparts++;
        ibuf[i] = (unsigned char) *indata;
        indata++;
        insize--;
      }
      else
        ibuf[i] = 0;
    }

    obuf[0] = (unsigned char)  ((ibuf[0] & 0xFC) >> 2);
    obuf[1] = (unsigned char) (((ibuf[0] & 0x03) << 4) | \
                               ((ibuf[1] & 0xF0) >> 4));
    obuf[2] = (unsigned char) (((ibuf[1] & 0x0F) << 2) | \
                               ((ibuf[2] & 0xC0) >> 6));
    obuf[3] = (unsigned char)   (ibuf[2] & 0x3F);

    switch(inputparts) {
    case 1: /* only one byte read */
      i = msnprintf(output, 5, "%c%c%s%s",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    padstr,
                    padstr);
      break;

    case 2: /* two bytes read */
      i = msnprintf(output, 5, "%c%c%c%s",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    table64[obuf[2]],
                    padstr);
      break;

    default:
      i = msnprintf(output, 5, "%c%c%c%c",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    table64[obuf[2]],
                    table64[obuf[3]]);
      break;
    }
    output += i;
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  /* Return the length of the new data */
  *outlen = output - base64data;

  return CURLE_OK;
}